

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasRoberts_FSA_dns.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long *extraout_RAX;
  N_Vector extraout_RAX_00;
  N_Vector *yQS;
  N_Vector yQ;
  int sensi_meth;
  int err_con;
  int sensi;
  N_Vector *ypS;
  N_Vector *yS;
  int is;
  sunrealtype pbar [3];
  char fname [256];
  FILE *FID;
  int retval;
  int iout;
  N_Vector id;
  N_Vector abstol;
  N_Vector yp;
  N_Vector y;
  sunrealtype tout;
  sunrealtype t;
  sunrealtype reltol;
  UserData data;
  SUNLinearSolver LS;
  SUNMatrix A;
  void *ida_mem;
  SUNContext ctx;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  N_Vector y_00;
  char **in_stack_fffffffffffffe28;
  N_Vector yp_00;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  void *ida_mem_00;
  long local_1b8;
  int local_1ac;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  char local_188 [264];
  FILE *local_80;
  undefined4 local_78;
  int local_74;
  long *local_70;
  long *local_68;
  long *local_60;
  long *local_58;
  double local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18 [2];
  int local_4;
  
  local_4 = 0;
  local_20 = 0;
  local_28 = 0;
  local_30 = 0;
  local_38 = (undefined8 *)0x0;
  local_58 = (long *)0x0;
  local_1b8 = 0;
  ida_mem_00 = (void *)0x0;
  y_00 = (N_Vector)0x0;
  ProcessArgs(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,(int *)0x0,
              (int *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),(int *)0x1024bb);
  local_78 = SUNContext_Create(0,local_18);
  iVar1 = check_retval(in_stack_fffffffffffffe28,(char *)y_00,in_stack_fffffffffffffe1c);
  if (iVar1 == 0) {
    local_38 = (undefined8 *)malloc(0x20);
    iVar1 = check_retval(in_stack_fffffffffffffe28,(char *)y_00,in_stack_fffffffffffffe1c);
    if (iVar1 == 0) {
      *local_38 = 0x3fa47ae147ae147b;
      local_38[1] = 0x40c3880000000000;
      local_38[2] = 0x417c9c3800000000;
      local_38[3] = 0x3fe0000000000000;
      free((void *)0x3);
      local_58 = extraout_RAX;
      iVar1 = check_retval(in_stack_fffffffffffffe28,(char *)y_00,in_stack_fffffffffffffe1c);
      if (iVar1 == 0) {
        **(undefined8 **)(*local_58 + 0x10) = 0x3ff0000000000000;
        *(undefined8 *)(*(long *)(*local_58 + 0x10) + 8) = 0;
        *(undefined8 *)(*(long *)(*local_58 + 0x10) + 0x10) = 0;
        local_60 = (long *)N_VClone(local_58);
        iVar1 = check_retval(in_stack_fffffffffffffe28,(char *)y_00,in_stack_fffffffffffffe1c);
        if (iVar1 == 0) {
          **(undefined8 **)(*local_60 + 0x10) = 0x3fb999999999999a;
          *(undefined8 *)(*(long *)(*local_60 + 0x10) + 8) = 0;
          *(undefined8 *)(*(long *)(*local_60 + 0x10) + 0x10) = 0;
          local_20 = IDACreate(local_18[0]);
          iVar1 = check_retval(in_stack_fffffffffffffe28,(char *)y_00,in_stack_fffffffffffffe1c);
          if (iVar1 == 0) {
            local_78 = IDAInit(0,local_20,res,local_58,local_60);
            iVar1 = check_retval(in_stack_fffffffffffffe28,(char *)y_00,in_stack_fffffffffffffe1c);
            if (iVar1 == 0) {
              local_40 = 0x3eb0c6f7a0b5ed8d;
              local_68 = (long *)N_VClone(local_58);
              **(undefined8 **)(*local_68 + 0x10) = 0x3e45798ee2308c3a;
              *(undefined8 *)(*(long *)(*local_68 + 0x10) + 8) = 0x3d06849b86a12b9b;
              *(undefined8 *)(*(long *)(*local_68 + 0x10) + 0x10) = 0x3eb0c6f7a0b5ed8d;
              local_78 = IDASVtolerances(local_40,local_20,local_68);
              iVar1 = check_retval(in_stack_fffffffffffffe28,(char *)y_00,in_stack_fffffffffffffe1c)
              ;
              if (iVar1 == 0) {
                local_70 = (long *)N_VClone(local_58);
                **(undefined8 **)(*local_70 + 0x10) = 0x3ff0000000000000;
                *(undefined8 *)(*(long *)(*local_70 + 0x10) + 8) = 0x3ff0000000000000;
                *(undefined8 *)(*(long *)(*local_70 + 0x10) + 0x10) = 0;
                local_78 = IDASetId(local_20,local_70);
                iVar1 = check_retval(in_stack_fffffffffffffe28,(char *)y_00,
                                     in_stack_fffffffffffffe1c);
                if (iVar1 == 0) {
                  local_78 = IDASetUserData(local_20,local_38);
                  iVar1 = check_retval(in_stack_fffffffffffffe28,(char *)y_00,
                                       in_stack_fffffffffffffe1c);
                  if (iVar1 == 0) {
                    local_28 = SUNDenseMatrix(3,3,local_18[0]);
                    iVar1 = check_retval(in_stack_fffffffffffffe28,(char *)y_00,
                                         in_stack_fffffffffffffe1c);
                    if (iVar1 == 0) {
                      local_30 = SUNLinSol_Dense(local_58,local_28,local_18[0]);
                      iVar1 = check_retval(in_stack_fffffffffffffe28,(char *)y_00,
                                           in_stack_fffffffffffffe1c);
                      if (iVar1 == 0) {
                        local_78 = IDASetLinearSolver(local_20,local_30,local_28);
                        iVar1 = check_retval(in_stack_fffffffffffffe28,(char *)y_00,
                                             in_stack_fffffffffffffe1c);
                        if (iVar1 == 0) {
                          printf("\n3-species chemical kinetics problem\n");
                          if (in_stack_fffffffffffffe3c == 0) {
                            printf("Sensitivity: NO ");
                          }
                          else {
                            local_1a8 = *local_38;
                            local_1a0 = local_38[1];
                            local_198 = local_38[2];
                            local_1b8 = N_VCloneVectorArray(3,local_58);
                            iVar1 = check_retval(in_stack_fffffffffffffe28,(char *)y_00,
                                                 in_stack_fffffffffffffe1c);
                            if (iVar1 != 0) {
                              return 1;
                            }
                            for (local_1ac = 0; local_1ac < 3; local_1ac = local_1ac + 1) {
                              N_VConst(0,*(undefined8 *)(local_1b8 + (long)local_1ac * 8));
                            }
                            ida_mem_00 = (void *)N_VCloneVectorArray(3,local_58);
                            iVar1 = check_retval(in_stack_fffffffffffffe28,(char *)y_00,
                                                 in_stack_fffffffffffffe1c);
                            if (iVar1 != 0) {
                              return 1;
                            }
                            for (local_1ac = 0; local_1ac < 3; local_1ac = local_1ac + 1) {
                              N_VConst(0,*(undefined8 *)((long)ida_mem_00 + (long)local_1ac * 8));
                            }
                            local_78 = IDASensInit(local_20,3,in_stack_fffffffffffffe34,resS,
                                                   local_1b8,ida_mem_00);
                            iVar1 = check_retval(in_stack_fffffffffffffe28,(char *)y_00,
                                                 in_stack_fffffffffffffe1c);
                            if (iVar1 != 0) {
                              return 1;
                            }
                            local_78 = IDASensEEtolerances(local_20);
                            iVar1 = check_retval(in_stack_fffffffffffffe28,(char *)y_00,
                                                 in_stack_fffffffffffffe1c);
                            if (iVar1 != 0) {
                              return 1;
                            }
                            local_78 = IDASetSensErrCon(local_20,in_stack_fffffffffffffe38);
                            iVar1 = check_retval(in_stack_fffffffffffffe28,(char *)y_00,
                                                 in_stack_fffffffffffffe1c);
                            if (iVar1 != 0) {
                              return 1;
                            }
                            local_78 = IDASetSensParams(local_20,local_38,&local_1a8,0);
                            iVar1 = check_retval(in_stack_fffffffffffffe28,(char *)y_00,
                                                 in_stack_fffffffffffffe1c);
                            if (iVar1 != 0) {
                              return 1;
                            }
                            printf("Sensitivity: YES ");
                            if (in_stack_fffffffffffffe34 == 1) {
                              printf("( SIMULTANEOUS +");
                            }
                            else {
                              printf("( STAGGERED +");
                            }
                            if (in_stack_fffffffffffffe38 == 0) {
                              printf(" PARTIAL ERROR CONTROL )");
                            }
                            else {
                              printf(" FULL ERROR CONTROL )");
                            }
                          }
                          free((void *)0x2);
                          **(undefined8 **)((long)extraout_RAX_00->content + 0x10) = 0;
                          *(undefined8 *)(*(long *)((long)extraout_RAX_00->content + 0x10) + 8) = 0;
                          yp_00 = extraout_RAX_00;
                          IDAQuadInit(local_20,rhsQ,extraout_RAX_00);
                          if (in_stack_fffffffffffffe3c != 0) {
                            y_00 = (N_Vector)N_VCloneVectorArray(3,yp_00);
                            for (local_1ac = 0; local_1ac < 3; local_1ac = local_1ac + 1) {
                              N_VConst(0,(&y_00->content)[local_1ac]);
                            }
                            IDAQuadSensInit(local_20,0,y_00);
                          }
                          local_78 = IDACalcIC(0x3fd999999999999a,local_20,1);
                          iVar1 = check_retval(yp_00,(char *)y_00,in_stack_fffffffffffffe1c);
                          if (iVar1 == 0) {
                            local_78 = IDAGetConsistentIC(local_20,local_58,local_60);
                            iVar1 = check_retval(yp_00,(char *)y_00,in_stack_fffffffffffffe1c);
                            if (iVar1 == 0) {
                              PrintIC(y_00,(N_Vector)
                                           CONCAT44(in_stack_fffffffffffffe1c,
                                                    in_stack_fffffffffffffe18));
                              if (in_stack_fffffffffffffe3c != 0) {
                                IDAGetSensConsistentIC(local_20,local_1b8,ida_mem_00);
                                PrintSensIC((N_Vector)
                                            CONCAT44(in_stack_fffffffffffffe34,
                                                     in_stack_fffffffffffffe30),yp_00,
                                            (N_Vector *)y_00,
                                            (N_Vector *)
                                            CONCAT44(in_stack_fffffffffffffe1c,
                                                     in_stack_fffffffffffffe18));
                              }
                              printf("\n\n");
                              printf("===========================================");
                              printf("============================\n");
                              printf("     T     Q       H      NST           y1");
                              printf("           y2           y3    \n");
                              printf("===========================================");
                              printf("============================\n");
                              local_50 = 0.4;
                              for (local_74 = 1; local_74 < 0xd; local_74 = local_74 + 1) {
                                local_78 = IDASolve(local_50,local_20,&local_48,local_58,local_60,1)
                                ;
                                iVar1 = check_retval(yp_00,(char *)y_00,in_stack_fffffffffffffe1c);
                                if (iVar1 != 0) break;
                                PrintOutput(ida_mem_00,
                                            (sunrealtype)
                                            CONCAT44(in_stack_fffffffffffffe3c,
                                                     in_stack_fffffffffffffe38),
                                            (N_Vector)
                                            CONCAT44(in_stack_fffffffffffffe34,
                                                     in_stack_fffffffffffffe30));
                                if (in_stack_fffffffffffffe3c != 0) {
                                  local_78 = IDAGetSens(local_20,&local_48,local_1b8);
                                  iVar1 = check_retval(yp_00,(char *)y_00,in_stack_fffffffffffffe1c)
                                  ;
                                  if (iVar1 != 0) break;
                                  PrintSensOutput((N_Vector *)y_00);
                                }
                                printf("-----------------------------------------");
                                printf("------------------------------\n");
                                local_50 = local_50 * 10.0;
                              }
                              printf("\nQuadrature:\n");
                              IDAGetQuad(local_20,&local_48,yp_00);
                              printf("G:      %10.4e\n",
                                     **(undefined8 **)((long)yp_00->content + 0x10));
                              if (in_stack_fffffffffffffe3c != 0) {
                                IDAGetQuadSens(local_20,&local_48,y_00);
                                printf("\nSensitivities at t=%g:\n",local_48);
                                printf("dG/dp1: %11.4e\n",**(undefined8 **)(*y_00->content + 0x10));
                                printf("dG/dp1: %11.4e\n",
                                       **(undefined8 **)(y_00->ops->nvgetvectorid + 0x10));
                                printf("dG/dp1: %11.4e\n",
                                       **(undefined8 **)(y_00->sunctx->profiler + 0x10));
                              }
                              printf("\nFinal Statistics:\n");
                              local_78 = IDAPrintAllStats(local_20,_stdout,0);
                              strcpy(local_188,"idasRoberts_FSA_dns_stats");
                              if (in_stack_fffffffffffffe3c != 0) {
                                if (in_stack_fffffffffffffe34 == 1) {
                                  strcat(local_188,"_-sensi_sim");
                                }
                                else {
                                  strcat(local_188,"_-sensi_stg");
                                }
                                if (in_stack_fffffffffffffe38 == 0) {
                                  strcat(local_188,"_f");
                                }
                                else {
                                  strcat(local_188,"_t");
                                }
                              }
                              strcat(local_188,".csv");
                              local_80 = fopen(local_188,"w");
                              local_78 = IDAPrintAllStats(local_20,local_80,1);
                              fclose(local_80);
                              N_VDestroy(local_58);
                              N_VDestroy(local_60);
                              N_VDestroy(local_68);
                              N_VDestroy(local_70);
                              N_VDestroy(yp_00);
                              if (in_stack_fffffffffffffe3c != 0) {
                                N_VDestroyVectorArray(local_1b8,3);
                                N_VDestroyVectorArray(ida_mem_00,3);
                                N_VDestroyVectorArray(y_00,3);
                              }
                              free(local_38);
                              IDAFree(&local_20);
                              SUNLinSolFree(local_30);
                              SUNMatDestroy(local_28);
                              SUNContext_Free(local_18);
                              local_4 = 0;
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext ctx;
  void* ida_mem;
  SUNMatrix A;
  SUNLinearSolver LS;
  UserData data;
  sunrealtype reltol, t, tout;
  N_Vector y, yp, abstol, id;
  int iout, retval;
  FILE* FID;
  char fname[256];

  sunrealtype pbar[NS];
  int is;
  N_Vector *yS, *ypS;
  sunbooleantype sensi, err_con;
  int sensi_meth;

  N_Vector yQ, *yQS;

  ida_mem = NULL;
  A       = NULL;
  LS      = NULL;
  data    = NULL;
  y       = NULL;
  yS      = NULL;
  ypS     = NULL;
  yQS     = NULL;

  /* Process arguments */
  ProcessArgs(argc, argv, &sensi, &sensi_meth, &err_con);

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* User data structure */
  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }
  data->p[0] = SUN_RCONST(0.040);
  data->p[1] = SUN_RCONST(1.0e4);
  data->p[2] = SUN_RCONST(3.0e7);
  data->coef = SUN_RCONST(0.5);

  /* Initial conditions */
  y = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  Ith(y, 1) = ONE;
  Ith(y, 2) = ZERO;
  Ith(y, 3) = ZERO;

  yp = N_VClone(y);
  if (check_retval((void*)yp, "N_VNew_Serial", 0)) { return (1); }

  /* These initial conditions are NOT consistent. See IDACalcIC below. */
  Ith(yp, 1) = SUN_RCONST(0.1);
  Ith(yp, 2) = ZERO;
  Ith(yp, 3) = ZERO;

  /* Create IDAS object */
  ida_mem = IDACreate(ctx);
  if (check_retval((void*)ida_mem, "IDACreate", 0)) { return (1); }

  /* Allocate space for IDAS */
  retval = IDAInit(ida_mem, res, T0, y, yp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  /* Specify scalar relative tol. and vector absolute tol. */
  reltol         = SUN_RCONST(1.0e-6);
  abstol         = N_VClone(y);
  Ith(abstol, 1) = SUN_RCONST(1.0e-8);
  Ith(abstol, 2) = SUN_RCONST(1.0e-14);
  Ith(abstol, 3) = SUN_RCONST(1.0e-6);
  retval         = IDASVtolerances(ida_mem, reltol, abstol);
  if (check_retval(&retval, "IDASVtolerances", 1)) { return (1); }

  /* Set ID vector */
  id         = N_VClone(y);
  Ith(id, 1) = 1.0;
  Ith(id, 2) = 1.0;
  Ith(id, 3) = 0.0;
  retval     = IDASetId(ida_mem, id);
  if (check_retval(&retval, "IDASetId", 1)) { return (1); }

  /* Attach user data */
  retval = IDASetUserData(ida_mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(y, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(ida_mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  printf("\n3-species chemical kinetics problem\n");

  /* Sensitivity-related settings */
  if (sensi)
  {
    pbar[0] = data->p[0];
    pbar[1] = data->p[1];
    pbar[2] = data->p[2];

    yS = N_VCloneVectorArray(NS, y);
    if (check_retval((void*)yS, "N_VCloneVectorArray", 0)) { return (1); }
    for (is = 0; is < NS; is++) { N_VConst(ZERO, yS[is]); }

    ypS = N_VCloneVectorArray(NS, y);
    if (check_retval((void*)ypS, "N_VCloneVectorArray", 0)) { return (1); }
    for (is = 0; is < NS; is++) { N_VConst(ZERO, ypS[is]); }

    /*
    * Only non-zero sensitivity I.C. are ypS[0]:
    * - Ith(ypS[0],1) = -ONE;
    * - Ith(ypS[0],2) =  ONE;
    *
    * They are not set. IDACalcIC also computes consistent IC for sensitivities.
    */

    retval = IDASensInit(ida_mem, NS, sensi_meth, resS, yS, ypS);
    if (check_retval(&retval, "IDASensInit", 1)) { return (1); }

    retval = IDASensEEtolerances(ida_mem);
    if (check_retval(&retval, "IDASensEEtolerances", 1)) { return (1); }

    retval = IDASetSensErrCon(ida_mem, err_con);
    if (check_retval(&retval, "IDASetSensErrCon", 1)) { return (1); }

    retval = IDASetSensParams(ida_mem, data->p, pbar, NULL);
    if (check_retval(&retval, "IDASetSensParams", 1)) { return (1); }

    printf("Sensitivity: YES ");
    if (sensi_meth == IDA_SIMULTANEOUS) { printf("( SIMULTANEOUS +"); }
    else { printf("( STAGGERED +"); }
    if (err_con) { printf(" FULL ERROR CONTROL )"); }
    else { printf(" PARTIAL ERROR CONTROL )"); }
  }
  else { printf("Sensitivity: NO "); }

  /*----------------------------------------------------------
   *               Q U A D R A T U R E S
   * ---------------------------------------------------------*/
  yQ = N_VNew_Serial(2, ctx);

  Ith(yQ, 1) = 0;
  Ith(yQ, 2) = 0;

  IDAQuadInit(ida_mem, rhsQ, yQ);

  if (sensi)
  {
    yQS = N_VCloneVectorArray(NS, yQ);
    for (is = 0; is < NS; is++) { N_VConst(ZERO, yQS[is]); }

    IDAQuadSensInit(ida_mem, NULL, yQS);
  }

  /* Call IDACalcIC to compute consistent initial conditions. If sensitivity is
     enabled, this function also try to find consistent IC for the sensitivities. */

  retval = IDACalcIC(ida_mem, IDA_YA_YDP_INIT, T1);
  ;
  if (check_retval(&retval, "IDACalcIC", 1)) { return (1); }

  retval = IDAGetConsistentIC(ida_mem, y, yp);
  if (check_retval(&retval, "IDAGetConsistentIC", 1)) { return (1); }

  PrintIC(y, yp);

  if (sensi)
  {
    IDAGetSensConsistentIC(ida_mem, yS, ypS);
    PrintSensIC(y, yp, yS, ypS);
  }

  /* In loop over output points, call IDA, print results, test for error */

  printf("\n\n");
  printf("===========================================");
  printf("============================\n");
  printf("     T     Q       H      NST           y1");
  printf("           y2           y3    \n");
  printf("===========================================");
  printf("============================\n");

  for (iout = 1, tout = T1; iout <= NOUT; iout++, tout *= TMULT)
  {
    retval = IDASolve(ida_mem, tout, &t, y, yp, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { break; }

    PrintOutput(ida_mem, t, y);

    if (sensi)
    {
      retval = IDAGetSens(ida_mem, &t, yS);
      if (check_retval(&retval, "IDAGetSens", 1)) { break; }
      PrintSensOutput(yS);
    }
    printf("-----------------------------------------");
    printf("------------------------------\n");
  }

  printf("\nQuadrature:\n");
  IDAGetQuad(ida_mem, &t, yQ);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("G:      %10.4Le\n", Ith(yQ, 1));
#else
  printf("G:      %10.4e\n", Ith(yQ, 1));
#endif

  if (sensi)
  {
    IDAGetQuadSens(ida_mem, &t, yQS);
#if defined(SUNDIALS_EXTENDED_PRECISION)
    printf("\nSensitivities at t=%Lg:\n", t);
    printf("dG/dp1: %11.4Le\n", Ith(yQS[0], 1));
    printf("dG/dp1: %11.4Le\n", Ith(yQS[1], 1));
    printf("dG/dp1: %11.4Le\n", Ith(yQS[2], 1));
#else
    printf("\nSensitivities at t=%g:\n", t);
    printf("dG/dp1: %11.4e\n", Ith(yQS[0], 1));
    printf("dG/dp1: %11.4e\n", Ith(yQS[1], 1));
    printf("dG/dp1: %11.4e\n", Ith(yQS[2], 1));
#endif
  }

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = IDAPrintAllStats(ida_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  strcpy(fname, "idasRoberts_FSA_dns_stats");
  if (sensi)
  {
    if (sensi_meth == IDA_SIMULTANEOUS) { strcat(fname, "_-sensi_sim"); }
    else { strcat(fname, "_-sensi_stg"); }
    if (err_con) { strcat(fname, "_t"); }
    else { strcat(fname, "_f"); }
  }
  strcat(fname, ".csv");
  FID    = fopen(fname, "w");
  retval = IDAPrintAllStats(ida_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Free memory */
  N_VDestroy(y);
  N_VDestroy(yp);
  N_VDestroy(abstol);
  N_VDestroy(id);
  N_VDestroy(yQ);
  if (sensi)
  {
    N_VDestroyVectorArray(yS, NS);
    N_VDestroyVectorArray(ypS, NS);
    N_VDestroyVectorArray(yQS, NS);
  }
  free(data);
  IDAFree(&ida_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNContext_Free(&ctx);

  return (0);
}